

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

void __thiscall
icu_63::BasicCalendarFactory::updateVisibleIDs
          (BasicCalendarFactory *this,Hashtable *result,UErrorCode *status)

{
  UHashtable *hash;
  UnicodeString *pUVar1;
  undefined4 uVar2;
  long lVar3;
  UnicodeString id;
  ConstChar16Ptr local_d8;
  BasicCalendarFactory *local_d0;
  Hashtable *local_c8;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    lVar3 = 0;
    local_d0 = this;
    local_c8 = result;
    do {
      UnicodeString::UnicodeString(&local_70,L'@');
      local_d8.p_ = L"calendar=";
      UnicodeString::UnicodeString(&local_b0,'\x01',&local_d8,-1);
      uVar2 = local_b0.fUnion.fFields.fLength;
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        uVar2 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      UnicodeString::doAppend(&local_70,&local_b0,0,uVar2);
      UnicodeString::~UnicodeString(&local_b0);
      local_c0 = local_d8.p_;
      UnicodeString::UnicodeString(&local_b0,*(char **)((long)gCalTypes + lVar3),-1,kInvariant);
      uVar2 = local_b0.fUnion.fFields.fLength;
      if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
        uVar2 = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      pUVar1 = &local_b0;
      UnicodeString::doAppend(&local_70,&local_b0,0,uVar2);
      UnicodeString::~UnicodeString(&local_b0);
      hash = local_c8->hash;
      pUVar1 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar1);
      if (pUVar1 != (UnicodeString *)0x0) {
        UnicodeString::UnicodeString(pUVar1,&local_70);
      }
      uhash_put_63(hash,pUVar1,local_d0,status);
      UnicodeString::~UnicodeString(&local_70);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x90);
  }
  return;
}

Assistant:

virtual void updateVisibleIDs(Hashtable& result, UErrorCode& status) const
    {
        if (U_SUCCESS(status)) {
            for(int32_t i=0;gCalTypes[i] != NULL;i++) {
                UnicodeString id((UChar)0x40); /* '@' a variant character */
                id.append(UNICODE_STRING_SIMPLE("calendar="));
                id.append(UnicodeString(gCalTypes[i], -1, US_INV));
                result.put(id, (void*)this, status);
            }
        }
    }